

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_virtual.c
# Opt level: O0

ssize_t archive_write_data_block(archive *a,void *buff,size_t s,int64_t o)

{
  int64_t o_local;
  size_t s_local;
  void *buff_local;
  archive *a_local;
  
  if (a->vtable->archive_write_data_block ==
      (_func_ssize_t_archive_ptr_void_ptr_size_t_int64_t *)0x0) {
    archive_set_error(a,-1,"archive_write_data_block not supported");
    a->state = 0x8000;
    a_local = (archive *)0xffffffffffffffe2;
  }
  else {
    a_local = (archive *)(*a->vtable->archive_write_data_block)(a,buff,s,o);
  }
  return (ssize_t)a_local;
}

Assistant:

ssize_t
archive_write_data_block(struct archive *a, const void *buff, size_t s, int64_t o)
{
	if (a->vtable->archive_write_data_block == NULL) {
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "archive_write_data_block not supported");
		a->state = ARCHIVE_STATE_FATAL;
		return (ARCHIVE_FATAL);
	}
	return ((a->vtable->archive_write_data_block)(a, buff, s, o));
}